

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengineex.cpp
# Opt level: O0

void __thiscall
QPaintEngineEx::drawStaticTextItem(QPaintEngineEx *this,QStaticTextItem *staticTextItem)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  Int IVar5;
  QFontEngine *pQVar6;
  QPainterState *pQVar7;
  QVectorPath *pQVar8;
  undefined8 *in_RSI;
  QPaintEngineEx *in_RDI;
  long in_FS_OFFSET;
  bool changedHints;
  QPainterState *s;
  QFontEngine *fontEngine;
  RenderHints oldHints;
  QPainterPath path;
  RenderHint in_stack_ffffffffffffff6c;
  QFlags<QPainter::RenderHint> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  FillRule in_stack_ffffffffffffff7c;
  FillRule FVar9;
  QPainterPath *in_stack_ffffffffffffff80;
  QFontEngine *this_00;
  undefined1 local_28 [8];
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_20;
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_1c;
  Int local_18;
  uint local_14;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)0x58b04c);
  QPainterPath::setFillRule(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  if (*(int *)(in_RSI + 2) != 0) {
    pQVar6 = QStaticTextItem::fontEngine((QStaticTextItem *)0x58b080);
    uVar2 = in_RSI[1];
    uVar3 = *in_RSI;
    uVar1 = *(uint *)(in_RSI + 2);
    this_00 = pQVar6;
    memset(&local_14,0,4);
    QFlags<QTextItem::RenderFlag>::QFlags((QFlags<QTextItem::RenderFlag> *)0x58b0d7);
    (*this_00->_vptr_QFontEngine[0xf])(this_00,uVar2,uVar3,(ulong)uVar1,&local_10,(ulong)local_14);
    bVar4 = QPainterPath::isEmpty((QPainterPath *)this_00);
    if (!bVar4) {
      pQVar7 = state(in_RDI);
      local_18 = (pQVar7->renderHints).super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
                 super_QFlagsStorage<QPainter::RenderHint>.i;
      local_1c.super_QFlagsStorage<QPainter::RenderHint>.i =
           (QFlagsStorage<QPainter::RenderHint>)
           QFlags<QPainter::RenderHint>::operator&
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
      FVar9 = in_stack_ffffffffffffff7c & 0xffffff;
      if ((IVar5 != 0) &&
         (FVar9 = in_stack_ffffffffffffff7c & 0xffffff,
         (*(ulong *)&(pQVar6->fontDef).field_0x60 & 0x100) == 0)) {
        local_20.super_QFlagsStorage<QPainter::RenderHint>.i =
             (QFlagsStorage<QPainter::RenderHint>)
             QFlags<QPainter::RenderHint>::operator&
                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
        FVar9 = CONCAT13(IVar5 != 0,(int3)FVar9) ^ 0xff000000;
      }
      bVar4 = (FVar9 & 0x1000000) != OddEvenFill;
      if (bVar4) {
        QFlags<QPainter::RenderHint>::operator|=(&pQVar7->renderHints,Antialiasing);
        (*(in_RDI->super_QPaintEngine)._vptr_QPaintEngine[0x26])();
      }
      pQVar8 = qtVectorPathForPath((QPainterPath *)0x58b1fd);
      QPen::brush((QPen *)CONCAT44(FVar9,in_stack_ffffffffffffff78));
      (*(in_RDI->super_QPaintEngine)._vptr_QPaintEngine[0x1a])(in_RDI,pQVar8,local_28);
      QBrush::~QBrush((QBrush *)0x58b237);
      if (bVar4) {
        (pQVar7->renderHints).super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
        super_QFlagsStorage<QPainter::RenderHint>.i = local_18;
        (*(in_RDI->super_QPaintEngine)._vptr_QPaintEngine[0x26])();
      }
    }
  }
  QPainterPath::~QPainterPath((QPainterPath *)0x58b272);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPaintEngineEx::drawStaticTextItem(QStaticTextItem *staticTextItem)
{
    QPainterPath path;
    path.setFillRule(Qt::WindingFill);

    if (staticTextItem->numGlyphs == 0)
        return;

    QFontEngine *fontEngine = staticTextItem->fontEngine();
    fontEngine->addGlyphsToPath(staticTextItem->glyphs, staticTextItem->glyphPositions,
                                staticTextItem->numGlyphs, &path, { });
    if (!path.isEmpty()) {
        QPainterState *s = state();
        QPainter::RenderHints oldHints = s->renderHints;
        bool changedHints = false;
        if (bool(oldHints & QPainter::TextAntialiasing)
            && !bool(fontEngine->fontDef.styleStrategy & QFont::NoAntialias)
            && !bool(oldHints & QPainter::Antialiasing)) {
            s->renderHints |= QPainter::Antialiasing;
            renderHintsChanged();
            changedHints = true;
        }

        fill(qtVectorPathForPath(path), s->pen.brush());

        if (changedHints) {
            s->renderHints = oldHints;
            renderHintsChanged();
        }
    }
}